

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

Error miniros::systemdNotify(char *status)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  long lVar5;
  Error_t EVar6;
  Error_t EVar7;
  SmartFd fd;
  sockaddr_union socket_addr;
  SmartFd local_ac;
  sockaddr local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 uStack_58;
  undefined6 uStack_50;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined8 uStack_42;
  
  local_a8.sa_data[6] = '\0';
  local_a8.sa_data[7] = '\0';
  local_a8.sa_data[8] = '\0';
  local_a8.sa_data[9] = '\0';
  local_a8.sa_data[10] = '\0';
  local_a8.sa_data[0xb] = '\0';
  local_a8.sa_data[0xc] = '\0';
  local_a8.sa_data[0xd] = '\0';
  uStack_48 = 0;
  uStack_42 = 0;
  uStack_58 = 0;
  uStack_50 = 0;
  local_4a = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_a8.sa_family = 1;
  local_a8.sa_data[0] = '\0';
  local_a8.sa_data[1] = '\0';
  local_a8.sa_data[2] = '\0';
  local_a8.sa_data[3] = '\0';
  local_a8.sa_data[4] = '\0';
  local_a8.sa_data[5] = '\0';
  local_ac.fd = -1;
  EVar6 = Ok;
  EVar7 = Ok;
  if ((status == (char *)0x0) || (__n = strlen(status), EVar7 = EVar6, __n == 0)) goto LAB_001c97a5;
  pcVar2 = getenv("NOTIFY_SOCKET");
  if (pcVar2 == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "No NOTIFY_SOCKET variable was set. No systemd notification will be done.",0x48);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    EVar7 = SystemError;
    std::ostream::flush();
    goto LAB_001c97a5;
  }
  if (((*pcVar2 != '@') && (*pcVar2 != '/')) || (sVar3 = strlen(pcVar2), 0x6b < sVar3))
  goto LAB_001c97a5;
  memcpy(local_a8.sa_data,pcVar2,sVar3);
  if (local_a8.sa_data[0] == '@') {
    local_a8.sa_data[0] = '\0';
  }
  local_ac.fd = socket(1,0x80002,0);
  if (local_ac.fd < 0) {
    lVar5 = 0x20;
    pcVar2 = "Failed to create sdnotify socket";
LAB_001c975b:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar2,lVar5);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  else {
    iVar1 = ::connect(local_ac.fd,&local_a8,(int)sVar3 + 2);
    if (iVar1 != 0) {
      lVar5 = 0x21;
      pcVar2 = "Failed to connect sdnotify socket";
      goto LAB_001c975b;
    }
    sVar3 = write(local_ac.fd,status,__n);
    EVar7 = Ok;
    if (sVar3 == __n) goto LAB_001c97a5;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Failed to write sdnotify message",0x20);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
    if (-1 < (long)sVar3) goto LAB_001c97a5;
  }
  piVar4 = __errno_location();
  EVar7 = (uint)(*piVar4 == 0) * 3;
LAB_001c97a5:
  SmartFd::~SmartFd(&local_ac);
  return (Error)EVar7;
}

Assistant:

static int portableSystemdNotify(const char *message) {

  union sockaddr_union {
    struct sockaddr sa;
    struct sockaddr_un sun;
  } socket_addr = {};

  socket_addr.sun.sun_family = AF_UNIX;

  size_t path_length, message_length;
  SmartFd fd;

  const char *socket_path;

  /* Verify the argument first */
  if (!message)
    return -EINVAL;

  message_length = strlen(message);
  if (message_length == 0)
    return -EINVAL;

  /* If the variable is not set, the protocol is a noop */
  socket_path = getenv("NOTIFY_SOCKET");
  if (!socket_path) {
    std::cerr << "No NOTIFY_SOCKET variable was set. No systemd notification will be done." << std::endl;
    return 0; /* Not set? Nothing to do */
  }

  /* Only AF_UNIX is supported, with path or abstract sockets */
  if (socket_path[0] != '/' && socket_path[0] != '@')
    return -EAFNOSUPPORT;

  path_length = strlen(socket_path);
  /* Ensure there is room for NUL byte */
  if (path_length >= sizeof(socket_addr.sun.sun_path))
    return -E2BIG;

  memcpy(socket_addr.sun.sun_path, socket_path, path_length);

  /* Support for abstract socket */
  if (socket_addr.sun.sun_path[0] == '@')
    socket_addr.sun.sun_path[0] = 0;

  fd.fd = socket(AF_UNIX, SOCK_DGRAM|SOCK_CLOEXEC, 0);
  if (fd < 0) {
    std::cerr << "Failed to create sdnotify socket" << std::endl;
    return -errno;
  }

  if (connect(fd, &socket_addr.sa, offsetof(struct sockaddr_un, sun_path) + path_length) != 0) {
    std::cerr << "Failed to connect sdnotify socket" << std::endl;
    return -errno;
  }

  ssize_t written = write(fd, message, message_length);
  if (written != (ssize_t) message_length) {
    std::cerr << "Failed to write sdnotify message" << std::endl;
    return written < 0 ? -errno : -EPROTO;
  }

  return 1; /* Notified! */
}